

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O0

void __thiscall
binlog::Session::Channel::Channel
          (Channel *this,Session *session,size_t queueCapacity,WriterProp *writerProp_)

{
  pointer pcVar1;
  WriterProp *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  WriterProp *in_RDI;
  char *queueBuffer;
  char *buffer;
  WriterProp *buffer_;
  WriterProp *this_00;
  
  buffer_ = in_RDI;
  WriterProp::WriterProp(in_RDI,in_RCX);
  this_00 = buffer_ + 1;
  operator_new__(in_RDX + 0x38);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RDI,(char *)in_RCX);
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RDI);
  pcVar1[0] = -0x44;
  pcVar1[1] = -0x44;
  pcVar1[2] = '4';
  pcVar1[3] = 'm';
  pcVar1[4] = 'q';
  pcVar1[5] = '?';
  pcVar1[6] = '!';
  pcVar1[7] = -2;
  *(undefined8 *)(pcVar1 + 8) = in_RSI;
  detail::Queue::Queue((Queue *)this_00,(char *)buffer_,(size_t)in_RDI);
  return;
}

Assistant:

inline Session::Channel::Channel(Session& session, std::size_t queueCapacity, WriterProp writerProp_)
  :writerProp(std::move(writerProp_)),
   _queue(new char[sizeof(std::uint64_t) + sizeof(Session*) + sizeof(detail::Queue) + queueCapacity])
{
  // To be able to recover unconsumed queue data from memory dumps,
  // put a magic number, a pointer to the owning session, the queue and the queue buffer
  // next to each other.
  char* buffer = _queue.get();

  // The magic number is used to indentify the queue in the memory dump
  new (buffer) std::uint64_t(0xFE213F716D34BCBC);
  buffer += sizeof(std::uint64_t);

  // Session* is used to separate the queues of different sessions of the program
  new (buffer) Session*(&session);
  buffer += sizeof(Session*);

  // Queue is used normally to store log events, and also during recovery,
  // to determine the unconsumed parts of the buffer.
  static_assert(alignof(detail::Queue) <= alignof(std::uint64_t), "");
  static_assert(alignof(detail::Queue) <= alignof(Session*), "");
  char* queueBuffer = buffer + sizeof(detail::Queue);
  new (buffer) detail::Queue(queueBuffer, queueCapacity);
}